

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envmaplight.hpp
# Opt level: O0

Color __thiscall EnvLight::radiance(EnvLight *this,Ray *ray)

{
  long in_RSI;
  long in_RDI;
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Color CVar5;
  vec2f *uv;
  Image *this_00;
  Image local_28 [2];
  
  uv = *(vec2f **)(in_RDI + 0x10);
  dVar4 = (double)PI;
  local_28[0]._8_8_ = in_RSI;
  dVar2 = atan2((double)*(float *)(in_RSI + 0x14),(double)*(float *)(in_RSI + 0xc));
  fVar1 = 1.0 / PI;
  dVar3 = acos((double)*(float *)(local_28[0]._8_8_ + 0x10));
  this_00 = local_28;
  vec2f::vec2f((vec2f *)this_00,(float)((0.5 / dVar4) * dVar2 + 0.5),(float)((double)fVar1 * dVar3))
  ;
  CVar5 = Image::sample(this_00,uv);
  return CVar5;
}

Assistant:

Color radiance(const Ray& ray) const
	{
		return texture->sample(vec2f(
			0.5+(0.5/PI)*atan2(ray.dir.z, ray.dir.x),
			(1/PI)*acos(ray.dir.y)
		));
	}